

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommunicationsChannelType.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::CommunicationsChannelType::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,CommunicationsChannelType *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Communications Channel Type:",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tType  : ",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tClass : ",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString CommunicationsChannelType::GetAsString() const
{
    KStringStream ss;

    ss << "Communications Channel Type:"
       << "\n\tType  : " << ( KUINT16 )m_ui8Type
       << "\n\tClass : " << ( KUINT16 )m_ui8Class
       << "\n";

    return ss.str();
}